

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packet.cpp
# Opt level: O0

Packet * __thiscall mognetwork::Packet::operator>>(Packet *this,char *data)

{
  Packet *in_RDI;
  int32_t size;
  int *in_stack_ffffffffffffffd8;
  
  operator>>(in_RDI,in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

Packet& Packet::operator>>(char* data)
  {
    int32_t size = 0;
    *this >> size;

    if (size > 0 && verifySize(size))
      {
	memcpy(data, &((*m_data)[m_readerPos]), size);
	data[size] = '\0';
	m_readerPos += size;
      }
    return (*this);
  }